

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownInFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  bool bVar1;
  PhysicalType PVar2;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var3;
  TableFilterSet *this_01;
  bool bVar4;
  BoundOperatorExpression *pBVar5;
  reference pvVar6;
  pointer pEVar7;
  BoundColumnRefExpression *pBVar8;
  BoundConstantExpression *pBVar9;
  ConstantFilter *pCVar10;
  BoundConstantExpression *pBVar11;
  reference pvVar12;
  ConstantFilter *this_02;
  OptionalFilter *this_03;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> this_04;
  pointer pOVar13;
  bool bVar14;
  pointer *__ptr;
  size_type sVar15;
  FilterPushdownResult FVar16;
  templated_unique_single_t optional_filter;
  vector<duckdb::Value,_true> in_list;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_c8;
  const_reference local_c0;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_b8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_b0;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_a8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_a0;
  vector<duckdb::Value,_true> local_98;
  Value local_78;
  TableFilterSet *local_38;
  
  FVar16 = NO_PUSHDOWN;
  if ((expr->super_BaseExpression).type == COMPARE_IN) {
    pBVar5 = BaseExpression::Cast<duckdb::BoundOperatorExpression>(&expr->super_BaseExpression);
    this_00 = &pBVar5->children;
    FVar16 = NO_PUSHDOWN;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](this_00,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    if ((pEVar7->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
      FVar16 = NO_PUSHDOWN;
      local_38 = table_filters;
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this_00,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      pBVar8 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar7->super_BaseExpression)
      ;
      local_c0 = vector<duckdb::ColumnIndex,_true>::operator[]
                           (column_ids,(pBVar8->binding).column_index);
      bVar4 = true;
      if (8 < (ulong)((long)(pBVar5->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pBVar5->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        sVar15 = 1;
        bVar14 = true;
        while( true ) {
          pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_00,sVar15);
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar6);
          if ((pEVar7->super_BaseExpression).type != VALUE_CONSTANT) break;
          pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](this_00,sVar15);
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar6);
          pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar7->super_BaseExpression);
          bVar1 = (pBVar9->value).is_null;
          bVar4 = false;
          if (bVar1 == false) {
            bVar4 = bVar14;
          }
          if ((bVar1 == true) ||
             (sVar15 = sVar15 + 1, bVar14 = bVar4,
             (ulong)((long)(pBVar5->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pBVar5->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) <= sVar15))
          goto LAB_01184c18;
        }
        bVar4 = false;
      }
LAB_01184c18:
      this_01 = local_38;
      if (bVar4) {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](this_00,1);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                           (&pEVar7->super_BaseExpression);
        if (((long)(pBVar5->children).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar5->children).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0x10) &&
           (((bVar4 = TypeIsNumeric((pBVar9->value).type_.physical_type_), bVar4 ||
             (PVar2 = (pBVar9->value).type_.physical_type_, PVar2 == VARCHAR)) || (PVar2 == BOOL))))
        {
          pCVar10 = (ConstantFilter *)operator_new(0x50);
          Value::Value(&local_78,&pBVar9->value);
          ConstantFilter::ConstantFilter(pCVar10,COMPARE_BOUNDARY_START,&local_78);
          Value::~Value(&local_78);
          local_a0._M_head_impl = (TableFilter *)pCVar10;
          TableFilterSet::PushFilter
                    (this_01,local_c0,
                     (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      *)&local_a0);
          if ((ConstantFilter *)local_a0._M_head_impl != (ConstantFilter *)0x0) {
            (*((TableFilter *)&(local_a0._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
          }
          FVar16 = PUSHED_DOWN_FULLY;
        }
        else {
          local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (8 < (ulong)((long)(pBVar5->children).
                                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pBVar5->children).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
            sVar15 = 1;
            do {
              pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       ::operator[](this_00,sVar15);
              pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->(pvVar6);
              pBVar11 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                                  (&pEVar7->super_BaseExpression);
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98,
                         &pBVar11->value);
              sVar15 = sVar15 + 1;
            } while (sVar15 < (ulong)((long)(pBVar5->children).
                                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pBVar5->children).
                                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          bVar4 = LogicalType::IsIntegral(&(pBVar9->value).type_);
          if ((bVar4) && (bVar4 = IsDenseRange(&local_98), bVar4)) {
            pvVar12 = vector<duckdb::Value,_true>::front(&local_98);
            pCVar10 = (ConstantFilter *)operator_new(0x50);
            Value::Value(&local_78,pvVar12);
            ConstantFilter::ConstantFilter(pCVar10,COMPARE_GREATERTHANOREQUALTO,&local_78);
            Value::~Value(&local_78);
            pvVar12 = vector<duckdb::Value,_true>::back(&local_98);
            this_02 = (ConstantFilter *)operator_new(0x50);
            Value::Value(&local_78,pvVar12);
            ConstantFilter::ConstantFilter(this_02,COMPARE_LESSTHANOREQUALTO,&local_78);
            Value::~Value(&local_78);
            local_a8._M_head_impl = (TableFilter *)pCVar10;
            TableFilterSet::PushFilter
                      (this_01,local_c0,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_a8);
            if ((ConstantFilter *)local_a8._M_head_impl != (ConstantFilter *)0x0) {
              (*((TableFilter *)&(local_a8._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])
                        ();
            }
            local_a8._M_head_impl = (TableFilter *)0x0;
            local_b0._M_head_impl = (TableFilter *)this_02;
            TableFilterSet::PushFilter
                      (this_01,local_c0,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_b0);
            if ((ConstantFilter *)local_b0._M_head_impl != (ConstantFilter *)0x0) {
              (*((TableFilter *)&(local_b0._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])
                        ();
            }
            local_b0._M_head_impl = (TableFilter *)0x0;
            FVar16 = PUSHED_DOWN_FULLY;
          }
          else {
            this_03 = (OptionalFilter *)operator_new(0x18);
            local_78.type_._0_8_ =
                 (__uniq_ptr_data<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true,_true>
                  )0x0;
            OptionalFilter::OptionalFilter
                      (this_03,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                                *)&local_78);
            local_c8._M_head_impl = this_03;
            if ((TableFilter *)local_78.type_._0_8_ != (TableFilter *)0x0) {
              (**(code **)(*(long *)local_78.type_._0_8_ + 8))();
            }
            this_04._M_head_impl = (TableFilter *)operator_new(0x28);
            local_78.type_._0_8_ =
                 local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_78.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_78.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            InFilter::InFilter((InFilter *)this_04._M_head_impl,
                               (vector<duckdb::Value,_true> *)&local_78);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78);
            pOVar13 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                      ::operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                                    *)&local_c8);
            _Var3._M_head_impl =
                 (pOVar13->child_filter).
                 super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                 .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
            (pOVar13->child_filter).
            super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
            super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
            .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = this_04._M_head_impl
            ;
            if (_Var3._M_head_impl != (TableFilter *)0x0) {
              (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableFilter + 8))();
            }
            local_b8._M_head_impl = &(local_c8._M_head_impl)->super_TableFilter;
            local_c8._M_head_impl = (OptionalFilter *)0x0;
            TableFilterSet::PushFilter
                      (this_01,local_c0,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_b8);
            if ((OptionalFilter *)local_b8._M_head_impl != (OptionalFilter *)0x0) {
              (*((TableFilter *)&(local_b8._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])
                        ();
            }
            local_b8._M_head_impl = (TableFilter *)0x0;
            if (local_c8._M_head_impl != (OptionalFilter *)0x0) {
              (*((local_c8._M_head_impl)->super_TableFilter)._vptr_TableFilter[1])();
            }
            FVar16 = PUSHED_DOWN_PARTIALLY;
          }
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98);
        }
      }
    }
  }
  return FVar16;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownInFilter(TableFilterSet &table_filters,
                                                         const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionType() != ExpressionType::COMPARE_IN) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &func = expr.Cast<BoundOperatorExpression>();
	D_ASSERT(func.children.size() > 1);
	if (func.children[0]->GetExpressionClass() != ExpressionClass::BOUND_COLUMN_REF) {
		// we need col IN (...) to be able to push this down
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &column_ref = func.children[0]->Cast<BoundColumnRefExpression>();
	auto &column_index = column_ids[column_ref.binding.column_index];
	//! check if all children are const expr
	bool children_constant = true;
	for (size_t i {1}; i < func.children.size(); i++) {
		if (func.children[i]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			children_constant = false;
			break;
		}
		auto &const_value_expr = func.children[i]->Cast<BoundConstantExpression>();
		if (const_value_expr.value.IsNull()) {
			// cannot simplify NULL values
			children_constant = false;
			break;
		}
	}
	if (!children_constant) {
		// all children must be constant
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &fst_const_value_expr = func.children[1]->Cast<BoundConstantExpression>();
	auto &type = fst_const_value_expr.value.type();

	if (func.children.size() == 2 && TypeSupportsConstantFilter(type)) {
		// col IN (literal) is equivalent to an equality comparison - push that down
		auto bound_eq_comparison = make_uniq<ConstantFilter>(ExpressionType::COMPARE_EQUAL, fst_const_value_expr.value);
		table_filters.PushFilter(column_index, std::move(bound_eq_comparison));
		return FilterPushdownResult::PUSHED_DOWN_FULLY;
	}

	//! Check if values are consecutive, if yes transform them to >= <= (only for integers)
	// e.g. if we have x IN (1, 2, 3, 4, 5) we transform this into x >= 1 AND x <= 5
	vector<Value> in_list;
	for (idx_t i = 1; i < func.children.size(); i++) {
		auto &const_value_expr = func.children[i]->Cast<BoundConstantExpression>();
		D_ASSERT(!const_value_expr.value.IsNull());
		in_list.push_back(const_value_expr.value);
	}
	if (type.IsIntegral() && IsDenseRange(in_list)) {
		// dense range! turn this into x >= min AND x <= max
		// IsDenseRange sorts in_list, so the front element is the min and the back element is the max
		auto lower_bound =
		    make_uniq<ConstantFilter>(ExpressionType::COMPARE_GREATERTHANOREQUALTO, std::move(in_list.front()));
		auto upper_bound =
		    make_uniq<ConstantFilter>(ExpressionType::COMPARE_LESSTHANOREQUALTO, std::move(in_list.back()));
		table_filters.PushFilter(column_index, std::move(lower_bound));
		table_filters.PushFilter(column_index, std::move(upper_bound));
		return FilterPushdownResult::PUSHED_DOWN_FULLY;
	}
	// if this is not a dense range we can push an optional filter for zone-map pruning
	auto optional_filter = make_uniq<OptionalFilter>();
	auto in_filter = make_uniq<InFilter>(std::move(in_list));
	optional_filter->child_filter = std::move(in_filter);
	table_filters.PushFilter(column_index, std::move(optional_filter));
	return FilterPushdownResult::PUSHED_DOWN_PARTIALLY;
}